

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O2

void uv::TCPClient::StartLog(char *logpath)

{
  ILog4zManager *pIVar1;
  
  pIVar1 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar1->_vptr_ILog4zManager[0xc])(pIVar1,0,1);
  pIVar1 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar1->_vptr_ILog4zManager[10])(pIVar1,0,0);
  pIVar1 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar1->_vptr_ILog4zManager[9])(pIVar1,0,0);
  pIVar1 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar1->_vptr_ILog4zManager[0xd])(pIVar1,0,100);
  if (logpath != (char *)0x0) {
    pIVar1 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar1->_vptr_ILog4zManager[0xb])(pIVar1,0,logpath);
  }
  pIVar1 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar1->_vptr_ILog4zManager[5])(pIVar1);
  return;
}

Assistant:

void TCPClient::StartLog(const char* logpath /*= nullptr*/)
{
    zsummer::log4z::ILog4zManager::GetInstance()->SetLoggerMonthdir(LOG4Z_MAIN_LOGGER_ID, true);
    zsummer::log4z::ILog4zManager::GetInstance()->SetLoggerDisplay(LOG4Z_MAIN_LOGGER_ID, false);
    zsummer::log4z::ILog4zManager::GetInstance()->SetLoggerLevel(LOG4Z_MAIN_LOGGER_ID, LOG_LEVEL_DEBUG);
    zsummer::log4z::ILog4zManager::GetInstance()->SetLoggerLimitSize(LOG4Z_MAIN_LOGGER_ID, 100);
    if (logpath) {
        zsummer::log4z::ILog4zManager::GetInstance()->SetLoggerPath(LOG4Z_MAIN_LOGGER_ID, logpath);
    }
    zsummer::log4z::ILog4zManager::GetInstance()->Start();
}